

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VertexAttribLocationsTest::getProgramInterface
          (VertexAttribLocationsTest *this,GLuint param_1,ProgramInterface *program_interface,
          VaryingPassthrough *param_3)

{
  ShaderInterface *this_00;
  
  this_00 = &program_interface->m_vertex;
  std::__cxx11::string::assign((char *)this_00);
  Utils::ShaderInterface::Input<void>
            (this_00,"vertex_index","layout (location = vertex_index_location)",0,2,
             (Type *)Utils::Type::uint,'\0',0,0x10,0,(void *)0x0,0);
  Utils::ShaderInterface::Input<void>
            (this_00,"instance_index","layout (location = instance_index_location)",0,5,
             (Type *)Utils::Type::uint,'\0',0,0x10,0x10,(void *)0x0,0);
  return;
}

Assistant:

ShaderInterface& ProgramInterface::GetShaderInterface(Shader::STAGES stage)
{
	ShaderInterface* interface = 0;

	switch (stage)
	{
	case Shader::COMPUTE:
		interface = &m_compute;
		break;
	case Shader::FRAGMENT:
		interface = &m_fragment;
		break;
	case Shader::GEOMETRY:
		interface = &m_geometry;
		break;
	case Shader::TESS_CTRL:
		interface = &m_tess_ctrl;
		break;
	case Shader::TESS_EVAL:
		interface = &m_tess_eval;
		break;
	case Shader::VERTEX:
		interface = &m_vertex;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return *interface;
}